

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load-balance-collective.hpp
# Opt level: O0

void diy::detail::move_block(Master *master,MoveInfo *move_info)

{
  int iVar1;
  uint uVar2;
  communicator *pcVar3;
  void *__args;
  MemoryBuffer *this;
  char *__to;
  long in_RSI;
  Master *in_RDI;
  Link *recv_link;
  void *recv_b;
  MemoryBuffer bb_1;
  int move_lid;
  Link *send_link;
  void *send_b;
  MemoryBuffer bb;
  undefined4 in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe2c;
  Master *in_stack_fffffffffffffe30;
  void *in_stack_fffffffffffffe38;
  Master *in_stack_fffffffffffffe40;
  Master *l;
  int i;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  FILE *in_stack_fffffffffffffe78;
  Link *in_stack_fffffffffffffe88;
  BinaryBuffer *in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe9c;
  Master *in_stack_fffffffffffffea0;
  
  if (*(int *)(in_RSI + 4) != *(int *)(in_RSI + 8)) {
    pcVar3 = Master::communicator(in_RDI);
    iVar1 = mpi::communicator::rank(pcVar3);
    if (iVar1 == *(int *)(in_RSI + 4)) {
      MemoryBuffer::MemoryBuffer
                ((MemoryBuffer *)in_stack_fffffffffffffe30,
                 CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      l = in_RDI;
      iVar1 = Master::lid(in_stack_fffffffffffffe40,(int)((ulong)in_stack_fffffffffffffe38 >> 0x20))
      ;
      Master::block(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
      Master::saver((Master *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      Catch::clara::std::function<void_(const_void_*,_diy::BinaryBuffer_&)>::operator()
                ((function<void_(const_void_*,_diy::BinaryBuffer_&)> *)in_stack_fffffffffffffe40,
                 in_stack_fffffffffffffe38,(BinaryBuffer *)in_stack_fffffffffffffe30);
      Catch::clara::std::function<void_(const_void_*,_diy::BinaryBuffer_&)>::~function
                ((function<void_(const_void_*,_diy::BinaryBuffer_&)> *)0x25c6f8);
      Master::communicator(in_RDI);
      mpi::communicator::send<std::vector<char,std::allocator<char>>>
                ((communicator *)in_stack_fffffffffffffe40,
                 (int)((ulong)in_stack_fffffffffffffe38 >> 0x20),(int)in_stack_fffffffffffffe38,
                 (vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffe30);
      uVar2 = Master::lid(in_stack_fffffffffffffe40,(int)((ulong)in_stack_fffffffffffffe38 >> 0x20))
      ;
      Master::link(in_RDI,(char *)(ulong)uVar2,__to);
      LinkFactory::save((BinaryBuffer *)CONCAT44(iVar1,in_stack_fffffffffffffe70),(Link *)l);
      i = (int)((ulong)l >> 0x20);
      Master::communicator(in_RDI);
      mpi::communicator::send<std::vector<char,std::allocator<char>>>
                ((communicator *)in_stack_fffffffffffffe40,
                 (int)((ulong)in_stack_fffffffffffffe38 >> 0x20),(int)in_stack_fffffffffffffe38,
                 (vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffe30);
      Master::lid(in_stack_fffffffffffffe40,(int)((ulong)in_stack_fffffffffffffe38 >> 0x20));
      Master::destroyer((Master *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      Master::release((Master *)CONCAT44(iVar1,in_stack_fffffffffffffe70),i);
      Catch::clara::std::function<void_(void_*)>::operator()
                ((function<void_(void_*)> *)in_stack_fffffffffffffe30,
                 (void *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      Catch::clara::std::function<void_(void_*)>::~function((function<void_(void_*)> *)0x25c81a);
      MemoryBuffer::~MemoryBuffer((MemoryBuffer *)in_stack_fffffffffffffe30);
    }
    else {
      pcVar3 = Master::communicator(in_RDI);
      iVar1 = mpi::communicator::rank(pcVar3);
      if (iVar1 == *(int *)(in_RSI + 8)) {
        MemoryBuffer::MemoryBuffer
                  ((MemoryBuffer *)in_stack_fffffffffffffe30,
                   CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
        Master::creator((Master *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
        __args = Catch::clara::std::function<void_*()>::operator()
                           ((function<void_*()> *)in_stack_fffffffffffffe30);
        Catch::clara::std::function<void_*()>::~function((function<void_*()> *)0x25c907);
        Master::communicator(in_RDI);
        mpi::communicator::recv<std::vector<char,std::allocator<char>>>
                  ((communicator *)in_stack_fffffffffffffe40,(int)((ulong)__args >> 0x20),
                   (int)__args,(vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffe30);
        Master::loader((Master *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
        Catch::clara::std::function<void_(void_*,_diy::BinaryBuffer_&)>::operator()
                  ((function<void_(void_*,_diy::BinaryBuffer_&)> *)in_stack_fffffffffffffe40,__args,
                   (BinaryBuffer *)in_stack_fffffffffffffe30);
        Catch::clara::std::function<void_(void_*,_diy::BinaryBuffer_&)>::~function
                  ((function<void_(void_*,_diy::BinaryBuffer_&)> *)0x25c982);
        Master::communicator(in_RDI);
        mpi::communicator::recv<std::vector<char,std::allocator<char>>>
                  ((communicator *)in_stack_fffffffffffffe40,(int)((ulong)__args >> 0x20),
                   (int)__args,(vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffe30);
        this = (MemoryBuffer *)LinkFactory::load(in_stack_fffffffffffffe90);
        Master::add(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,this,
                    in_stack_fffffffffffffe88);
        MemoryBuffer::~MemoryBuffer(this);
      }
    }
    return;
  }
  fmt::v7::print<char[79],,char>
            (in_stack_fffffffffffffe78,
             (char (*) [79])CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
  abort();
}

Assistant:

inline void move_block(diy::Master&            master,
                const MoveInfo&         move_info)
{
    // sanity check that source and destination are different
    if (move_info.src_proc == move_info.dst_proc)
    {
        fmt::print(stderr, "Error: move_block(): source and destination are same. This should not happen.\n");
        abort();
    }

    if (master.communicator().rank() == move_info.src_proc)
    {
        diy::MemoryBuffer bb;

        // move the block from src to dst proc
        void* send_b = master.block(master.lid(move_info.move_gid));
        master.saver()(send_b, bb);
        master.communicator().send(move_info.dst_proc, 0, bb.buffer);

        // move the link for the moving block
        diy::Link* send_link = master.link(master.lid(move_info.move_gid));
        diy::LinkFactory::save(bb, send_link);
        master.communicator().send(move_info.dst_proc, 0, bb.buffer);

        // remove the block from the master
        int move_lid = master.lid(move_info.move_gid);
        master.destroyer()(master.release(move_lid));
    }
    else if (master.communicator().rank() == move_info.dst_proc)
    {
        diy::MemoryBuffer bb;

        // move the block from src to dst proc
        void* recv_b = master.creator()();
        master.communicator().recv(move_info.src_proc, 0, bb.buffer);
        master.loader()(recv_b, bb);

        // move the link for the moving block
        diy::Link* recv_link;
        master.communicator().recv(move_info.src_proc, 0, bb.buffer);
        recv_link = diy::LinkFactory::load(bb);

        // add the block to the master
        master.add(move_info.move_gid, recv_b, recv_link);
    }
}